

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

date_t duckdb::CastTimestampNsToDate::Operation<duckdb::timestamp_t,duckdb::date_t>
                 (timestamp_t input)

{
  date_t dVar1;
  timestamp_t timestamp;
  
  if (input.value == 0x7fffffffffffffff) {
    return (date_t)0x7fffffff;
  }
  if (input.value == -0x7fffffffffffffff) {
    return (date_t)-0x7fffffff;
  }
  timestamp = Timestamp::FromEpochNanoSeconds(input.value);
  dVar1 = Timestamp::GetDate(timestamp);
  return (date_t)dVar1.days;
}

Assistant:

date_t CastTimestampNsToDate::Operation(timestamp_t input) {
	if (input == timestamp_t::infinity()) {
		return date_t::infinity();
	} else if (input == timestamp_t::ninfinity()) {
		return date_t::ninfinity();
	}
	const auto us = CastTimestampNsToUs::Operation<timestamp_t, timestamp_t>(input);
	return Timestamp::GetDate(us);
}